

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O1

void __thiscall ApprovalTests::Options::Options(Options *this,Reporter *reporter)

{
  undefined1 auStack_38 [16];
  code *local_28;
  code *local_20;
  
  (this->fileOptions_).options_ = (Options *)0x0;
  (this->fileOptions_).fileExtensionWithDot_._M_dataplus._M_p =
       (pointer)&(this->fileOptions_).fileExtensionWithDot_.field_2;
  *(undefined4 *)&(this->fileOptions_).fileExtensionWithDot_.field_2 = 0x7478742e;
  (this->fileOptions_).fileExtensionWithDot_._M_string_length = 4;
  (this->fileOptions_).fileExtensionWithDot_.field_2._M_local_buf[4] = '\0';
  *(undefined8 *)&(this->scrubber_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->scrubber_).super__Function_base._M_functor + 8) = 0;
  (this->scrubber_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->scrubber_)._M_invoker = (_Invoker_type)0x0;
  *(code **)&(this->scrubber_).super__Function_base._M_functor = Scrubbers::doNothing;
  (this->scrubber_)._M_invoker =
       ::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  (this->scrubber_).super__Function_base._M_manager =
       ::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  this->reporter_ = reporter;
  DefaultNamerFactory::getDefaultNamer();
  if (local_28 != (code *)0x0) {
    (*local_20)(&this->namer_);
    if (local_28 != (code *)0x0) {
      (*local_28)(auStack_38,auStack_38,3);
    }
    this->usingDefaultScrubber_ = true;
    return;
  }
  ::std::__throw_bad_function_call();
}

Assistant:

Options::Options(const Reporter& reporter) : reporter_(reporter)
    {
    }